

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

char * catstr(char *a,char *b)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  
  if (a != (char *)0x0) {
    sVar1 = strlen(a);
    sVar2 = strlen(b);
    pcVar3 = (char *)malloc(sVar1 + sVar2 + 2);
    strcpy(pcVar3,a);
    sVar1 = strlen(pcVar3);
    (pcVar3 + sVar1)[0] = '_';
    (pcVar3 + sVar1)[1] = '\0';
    pcVar3 = strcat(pcVar3,b);
    return pcVar3;
  }
  return b;
}

Assistant:

static char *catstr (char *a, char *b) {
	if (!a)
		return b;
	char *res = malloc (strlen(a) + strlen(b) + 2);
	strcpy(res, a);
	strcat(res, "_");
	strcat(res, b);
	return res;
}